

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O1

Slice * __thiscall Imf_3_4::FrameBuffer::findSlice(FrameBuffer *this,char *name)

{
  iterator iVar1;
  Slice *pSVar2;
  key_type local_110;
  
  strncpy(local_110._text,name,0xff);
  local_110._text[0xff] = '\0';
  iVar1 = std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  *)this,&local_110);
  pSVar2 = (Slice *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Slice *)(iVar1._M_node + 9);
  }
  return pSVar2;
}

Assistant:

Slice*
FrameBuffer::findSlice (const char name[])
{
    SliceMap::iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : &i->second;
}